

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

int QtPrivate::compareStrings(QStringView lhs,QLatin1StringView rhs,CaseSensitivity cs)

{
  char16_t *pcVar1;
  byte bVar2;
  char16_t cVar3;
  int iVar4;
  ulong uVar5;
  ulong blen;
  ulong alen;
  char16_t *a;
  byte *b;
  
  blen = rhs.m_size;
  b = (byte *)rhs.m_data;
  alen = lhs.m_size;
  a = lhs.m_data;
  if (cs != CaseSensitive) {
    iVar4 = ucstricmp(alen,a,blen,(char *)b);
    return iVar4;
  }
  uVar5 = blen;
  if (alen < blen) {
    uVar5 = alen;
  }
  pcVar1 = a + uVar5;
  do {
    if (pcVar1 <= a) {
      iVar4 = (((long)blen < (long)alen) - 1) + (uint)((long)blen < (long)alen);
      if (alen == blen) {
        iVar4 = 0;
      }
      return iVar4;
    }
    cVar3 = *a;
    bVar2 = *b;
    a = a + 1;
    b = b + 1;
  } while ((uint)(ushort)cVar3 - (uint)bVar2 == 0);
  return (uint)(ushort)cVar3 - (uint)bVar2;
}

Assistant:

int QtPrivate::compareStrings(QStringView lhs, QLatin1StringView rhs, Qt::CaseSensitivity cs) noexcept
{
    if (cs == Qt::CaseSensitive)
        return ucstrcmp(lhs.utf16(), lhs.size(), rhs.latin1(), rhs.size());
    return ucstricmp(lhs.size(), lhs.utf16(), rhs.size(), rhs.latin1());
}